

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void MapOptHandler_sky2(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  double dVar2;
  
  FMapInfoParser::ParseAssign(parse);
  FMapInfoParser::ParseLumpOrTextureName(parse,&info->SkyPic2);
  bVar1 = FMapInfoParser::CheckFloat(parse);
  if (bVar1) {
    dVar2 = (parse->sc).Float;
    if (parse->HexenHack == true) {
      dVar2 = dVar2 * 0.00390625;
      (parse->sc).Float = dVar2;
    }
    info->skyspeed2 = (float)(dVar2 * 0.035);
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(sky2, true)
{
	parse.ParseAssign();
	parse.ParseLumpOrTextureName(info->SkyPic2);
	if (parse.CheckFloat())
	{
		if (parse.HexenHack)
		{
			parse.sc.Float /= 256;
		}
		info->skyspeed2 = float(parse.sc.Float * (35. / 1000.));
	}
}